

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O1

void __thiscall duckdb::QueryProfiler::SetInfo(QueryProfiler *this,double *blocked_thread_time)

{
  bool bVar1;
  int iVar2;
  pointer pPVar3;
  mapped_type *this_00;
  key_type local_59;
  Value local_58;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar2 == 0) {
    if (((this->is_explain_analyze != false) || ((this->context->config).enable_profiler == true))
       && (this->running == true)) {
      pPVar3 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>::
               operator->(&this->root);
      bVar1 = ProfilingInfo::Enabled
                        (&(pPVar3->profiling_info).expanded_settings,BLOCKED_THREAD_TIME);
      if (bVar1) {
        Value::Value(&local_58,*blocked_thread_time);
        local_59 = BLOCKED_THREAD_TIME;
        this_00 = ::std::__detail::
                  _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&(this->query_info).query_global_info.metrics,&local_59);
        Value::operator=(this_00,&local_58);
        Value::~Value(&local_58);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

void QueryProfiler::SetInfo(const double &blocked_thread_time) {
	lock_guard<std::mutex> guard(lock);
	if (!IsEnabled() || !running) {
		return;
	}

	auto &info = root->GetProfilingInfo();
	if (info.Enabled(info.expanded_settings, MetricsType::BLOCKED_THREAD_TIME)) {
		query_info.query_global_info.metrics[MetricsType::BLOCKED_THREAD_TIME] = blocked_thread_time;
	}
}